

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O1

int __thiscall
CGraphics_Threaded::LoadTextureRawSub
          (CGraphics_Threaded *this,CTextureHandle TextureID,int x,int y,int Width,int Height,
          int Format,void *pData)

{
  void *dest;
  int iVar1;
  uint size;
  long in_FS_OFFSET;
  CTextureUpdateCommand local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < TextureID.m_Id) {
    local_58.super_CCommand.m_Cmd = 5;
    local_58.super_CCommand.m_pNext = (CCommand *)0x0;
    local_58.m_Format = 2;
    if ((uint)Format < 3) {
      local_58.m_Format = Format + 1;
    }
    iVar1 = 0;
    if ((uint)Format < 3) {
      iVar1 = *(int *)(&DAT_001d73d8 + (ulong)(uint)Format * 4);
    }
    size = Height * Width * iVar1;
    local_58.m_Slot = TextureID.m_Id;
    local_58.m_X = x;
    local_58.m_Y = y;
    local_58.m_Width = Width;
    local_58.m_Height = Height;
    dest = mem_alloc(size);
    mem_copy(dest,pData,size);
    local_58.m_pData = dest;
    CCommandBuffer::AddCommand<CCommandBuffer::CTextureUpdateCommand>
              (this->m_pCommandBuffer,&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int CGraphics_Threaded::LoadTextureRawSub(CTextureHandle TextureID, int x, int y, int Width, int Height, int Format, const void *pData)
{
	if(!TextureID.IsValid())
		return 0;

	CCommandBuffer::CTextureUpdateCommand Cmd;
	Cmd.m_Slot = TextureID.Id();
	Cmd.m_X = x;
	Cmd.m_Y = y;
	Cmd.m_Width = Width;
	Cmd.m_Height = Height;
	Cmd.m_Format = ImageFormatToTexFormat(Format);

	// calculate memory usage
	const int MemSize = Width * Height * CImageInfo::GetPixelSize(Format);

	// copy texture data
	void *pTmpData = mem_alloc(MemSize);
	mem_copy(pTmpData, pData, MemSize);
	Cmd.m_pData = pTmpData;

	//
	m_pCommandBuffer->AddCommand(Cmd);
	return 0;
}